

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O3

void __thiscall asl::Date::Date(Date *this,String *str,String *fmt)

{
  byte *pbVar1;
  byte bVar2;
  int h;
  int month;
  int s;
  int day;
  int m;
  anon_union_16_2_78e7fdac_for_String_2 *paVar3;
  anon_union_16_2_78e7fdac_for_String_2 *__nptr;
  int local_44;
  
  if (fmt->_size == 0) {
    paVar3 = &fmt->field_2;
  }
  else {
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)(fmt->field_2)._str;
  }
  if (str->_size == 0) {
    __nptr = &str->field_2;
  }
  else {
    __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(str->field_2)._str;
  }
  local_44 = 0;
  month = 0;
  day = 0;
  h = 0;
  m = 0;
  s = 0;
LAB_001378d1:
  while( true ) {
    bVar2 = paVar3->_space[0];
    paVar3 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)paVar3 + 1);
    if (bVar2 < 0x59) break;
    if (bVar2 < 0x6d) {
      if (bVar2 == 0x59) {
        local_44 = atoi(__nptr->_space);
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
      else {
        if (bVar2 != 0x68) goto LAB_0013798e;
        h = atoi(__nptr->_space);
        bVar2 = __nptr->_space[0];
        while ((byte)(bVar2 - 0x30) < 10) {
          pbVar1 = (byte *)(__nptr->_space + 1);
          __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
          bVar2 = *pbVar1;
        }
      }
    }
    else if (bVar2 == 0x6d) {
      m = atoi(__nptr->_space);
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
    }
    else {
      if (bVar2 != 0x73) goto LAB_0013798e;
      s = atoi(__nptr->_space);
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
    }
  }
  if (bVar2 < 0x44) {
    if (bVar2 != 0x3f) {
      if (bVar2 == 0) {
        construct(this,LOCAL,local_44,month,day,h,m,s);
        return;
      }
      goto LAB_0013798e;
    }
  }
  else {
    if (bVar2 == 0x44) {
      day = atoi(__nptr->_space);
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
      goto LAB_001378d1;
    }
    if (bVar2 == 0x4d) {
      month = atoi(__nptr->_space);
      bVar2 = __nptr->_space[0];
      while ((byte)(bVar2 - 0x30) < 10) {
        pbVar1 = (byte *)(__nptr->_space + 1);
        __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)(__nptr->_space + 1);
        bVar2 = *pbVar1;
      }
      goto LAB_001378d1;
    }
LAB_0013798e:
    if (__nptr->_space[0] != bVar2) {
      this->_t = 0.0;
      return;
    }
  }
  __nptr = (anon_union_16_2_78e7fdac_for_String_2 *)((long)__nptr + 1);
  goto LAB_001378d1;
}

Assistant:

Date::Date(const String& str, const String& fmt)
{
	const char* f = fmt;
	const char* s = str;
	int         year = 0, month = 0, day = 0, hour = 0, minute = 0, second = 0;

	while (char c = *f++)
	{
		switch (c)
		{
		case 'Y':
			year = parseSkipNumber(s);
			break;
		case 'D':
			day = parseSkipNumber(s);
			break;
		case 'M':
			month = parseSkipNumber(s);
			break;
		case 'h':
			hour = parseSkipNumber(s);
			break;
		case 'm':
			minute = parseSkipNumber(s);
			break;
		case 's':
			second = parseSkipNumber(s);
			break;
		default:
			if (c != '?' && *s != c)
			{
				_t = 0;
				return;
			}
			s++;
		}
	}
	construct(LOCAL, year, month, day, hour, minute, second);
}